

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O3

void __thiscall
duckdb::RadixPartitionedColumnData::RadixPartitionedColumnData
          (RadixPartitionedColumnData *this,RadixPartitionedColumnData *other)

{
  idx_t iVar1;
  ColumnDataCollection *pCVar2;
  ulong uVar3;
  ulong uVar4;
  ColumnDataCollection *local_30;
  
  PartitionedColumnData::PartitionedColumnData
            (&this->super_PartitionedColumnData,&other->super_PartitionedColumnData);
  (this->super_PartitionedColumnData)._vptr_PartitionedColumnData =
       (_func_int **)&PTR__RadixPartitionedColumnData_0244f198;
  iVar1 = other->hash_col_idx;
  this->radix_bits = other->radix_bits;
  this->hash_col_idx = iVar1;
  uVar4 = 1;
  do {
    PartitionedColumnData::CreatePartitionCollection
              ((PartitionedColumnData *)&stack0xffffffffffffffd0,(idx_t)this);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>
                *)&(this->super_PartitionedColumnData).partitions,
               (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                *)&stack0xffffffffffffffd0);
    pCVar2 = local_30;
    if (local_30 != (ColumnDataCollection *)0x0) {
      ColumnDataCollection::~ColumnDataCollection(local_30);
      operator_delete(pCVar2);
    }
    uVar3 = uVar4 >> ((byte)this->radix_bits & 0x3f);
    uVar4 = uVar4 + 1;
  } while (uVar3 == 0);
  return;
}

Assistant:

RadixPartitionedColumnData::RadixPartitionedColumnData(const RadixPartitionedColumnData &other)
    : PartitionedColumnData(other), radix_bits(other.radix_bits), hash_col_idx(other.hash_col_idx) {
	for (idx_t i = 0; i < RadixPartitioning::NumberOfPartitions(radix_bits); i++) {
		partitions.emplace_back(CreatePartitionCollection(i));
	}
}